

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonAppendString(JsonString *p,char *zIn,u32 N)

{
  u64 uVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if ((zIn != (char *)0x0) &&
     ((uVar5 = (ulong)N, p->nUsed + uVar5 + 2 < p->nAlloc || (iVar3 = jsonGrow(p,N + 2), iVar3 == 0)
      ))) {
    uVar1 = p->nUsed;
    p->nUsed = uVar1 + 1;
    p->zBuf[uVar1] = '\"';
    if (N != 0) {
      lVar7 = uVar5 + 3;
      lVar6 = uVar5 + 7;
      do {
        bVar4 = *zIn;
        bVar2 = bVar4;
        if ((bVar4 == 0x5c) || (bVar4 == 0x22)) {
LAB_001bf438:
          bVar4 = bVar2;
          if ((p->nAlloc < p->nUsed + lVar7) && (iVar3 = jsonGrow(p,(u32)lVar7), iVar3 != 0)) {
            return;
          }
          uVar1 = p->nUsed;
          p->nUsed = uVar1 + 1;
          p->zBuf[uVar1] = '\\';
        }
        else if (bVar4 < 0x20) {
          bVar2 = ""[bVar4];
          if (""[bVar4] != 0) goto LAB_001bf438;
          if ((p->nAlloc < p->nUsed + lVar6) && (iVar3 = jsonGrow(p,(u32)lVar7 + 4), iVar3 != 0)) {
            return;
          }
          uVar1 = p->nUsed;
          p->nUsed = uVar1 + 1;
          p->zBuf[uVar1] = '\\';
          uVar1 = p->nUsed;
          p->nUsed = uVar1 + 1;
          p->zBuf[uVar1] = 'u';
          uVar1 = p->nUsed;
          p->nUsed = uVar1 + 1;
          p->zBuf[uVar1] = '0';
          uVar1 = p->nUsed;
          p->nUsed = uVar1 + 1;
          p->zBuf[uVar1] = '0';
          uVar1 = p->nUsed;
          p->nUsed = uVar1 + 1;
          p->zBuf[uVar1] = bVar4 >> 4 | 0x30;
          bVar4 = "0123456789abcdef"[bVar4 & 0xf];
        }
        uVar1 = p->nUsed;
        p->nUsed = uVar1 + 1;
        p->zBuf[uVar1] = bVar4;
        lVar7 = lVar7 + -1;
        zIn = (char *)((byte *)zIn + 1);
        lVar6 = lVar6 + 1;
      } while (lVar7 != 3);
    }
    uVar1 = p->nUsed;
    p->nUsed = uVar1 + 1;
    p->zBuf[uVar1] = '\"';
  }
  return;
}

Assistant:

static void jsonAppendString(JsonString *p, const char *zIn, u32 N){
  u32 i;
  if( zIn==0 || ((N+p->nUsed+2 >= p->nAlloc) && jsonGrow(p,N+2)!=0) ) return;
  p->zBuf[p->nUsed++] = '"';
  for(i=0; i<N; i++){
    unsigned char c = ((unsigned const char*)zIn)[i];
    if( c=='"' || c=='\\' ){
      json_simple_escape:
      if( (p->nUsed+N+3-i > p->nAlloc) && jsonGrow(p,N+3-i)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
    }else if( c<=0x1f ){
      static const char aSpecial[] = {
         0, 0, 0, 0, 0, 0, 0, 0, 'b', 't', 'n', 0, 'f', 'r', 0, 0,
         0, 0, 0, 0, 0, 0, 0, 0,   0,   0,   0, 0,   0,   0, 0, 0
      };
      assert( sizeof(aSpecial)==32 );
      assert( aSpecial['\b']=='b' );
      assert( aSpecial['\f']=='f' );
      assert( aSpecial['\n']=='n' );
      assert( aSpecial['\r']=='r' );
      assert( aSpecial['\t']=='t' );
      if( aSpecial[c] ){
        c = aSpecial[c];
        goto json_simple_escape;
      }
      if( (p->nUsed+N+7+i > p->nAlloc) && jsonGrow(p,N+7-i)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
      p->zBuf[p->nUsed++] = 'u';
      p->zBuf[p->nUsed++] = '0';
      p->zBuf[p->nUsed++] = '0';
      p->zBuf[p->nUsed++] = '0' + (c>>4);
      c = "0123456789abcdef"[c&0xf];
    }
    p->zBuf[p->nUsed++] = c;
  }
  p->zBuf[p->nUsed++] = '"';
  assert( p->nUsed<p->nAlloc );
}